

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Areal_Object_State_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Areal_Object_State_PDU::Decode
          (Areal_Object_State_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  KException *this_00;
  int iVar2;
  undefined7 in_register_00000011;
  ushort uVar3;
  allocator<char> local_49;
  WorldCoordinates local_48;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar2 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar2 = 0;
  }
  if (0x2f < iVar2 + (uint)KVar1) {
    std::
    vector<KDIS::DATA_TYPE::WorldCoordinates,_std::allocator<KDIS::DATA_TYPE::WorldCoordinates>_>::
    clear(&this->m_vPoints);
    Object_State_Header::Decode(&this->super_Object_State_Header,stream,ignoreHeader);
    KDataStream::Read(stream,&(this->super_Object_State_Header).field_0x4b);
    (*(this->m_ObjTyp).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_ObjTyp,stream);
    (*(this->m_Apperance).super_ObjectAppearance.super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_Apperance,stream);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16NumPoints);
    (*(this->m_ReqID).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_ReqID,stream);
    (*(this->m_RecvID).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_RecvID,stream);
    for (uVar3 = 0; uVar3 < this->m_ui16NumPoints; uVar3 = uVar3 + 1) {
      DATA_TYPE::WorldCoordinates::WorldCoordinates(&local_48,stream);
      std::
      vector<KDIS::DATA_TYPE::WorldCoordinates,_std::allocator<KDIS::DATA_TYPE::WorldCoordinates>_>
      ::emplace_back<KDIS::DATA_TYPE::WorldCoordinates>(&this->m_vPoints,&local_48);
      DATA_TYPE::DataTypeBase::~DataTypeBase(&local_48.super_DataTypeBase);
    }
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"Decode",&local_49);
  KException::KException(this_00,(KString *)&local_48,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Areal_Object_State_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < AREAL_OBJECT_STATE_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vPoints.clear();

    Object_State_Header::Decode( stream, ignoreHeader );

    stream >> m_ModificationUnion.m_ui8Modifications
           >> KDIS_STREAM m_ObjTyp
           >> KDIS_STREAM m_Apperance
           >> m_ui16NumPoints
           >> KDIS_STREAM m_ReqID
           >> KDIS_STREAM m_RecvID;

    for( KUINT16 i = 0; i < m_ui16NumPoints; ++i )
    {
        m_vPoints.push_back( WorldCoordinates( stream ) );
    }
}